

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

int bitset_container_compute_cardinality(bitset_container_t *bitset)

{
  __m256i *data;
  uint uVar1;
  long lVar2;
  uint64_t uVar3;
  uint64_t in_RSI;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ushort uVar7;
  int iVar9;
  undefined8 uVar12;
  int iVar22;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar20 [16];
  char cVar23;
  byte bVar41;
  char cVar42;
  byte bVar43;
  char cVar44;
  byte bVar45;
  char cVar46;
  byte bVar47;
  char cVar48;
  byte bVar49;
  undefined1 auVar24 [12];
  undefined1 auVar33 [16];
  undefined1 auVar26 [12];
  undefined1 auVar36 [16];
  undefined1 auVar27 [12];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar50 [12];
  undefined1 auVar51 [12];
  undefined1 auVar55 [16];
  undefined4 uVar8;
  undefined6 uVar10;
  undefined8 uVar11;
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  undefined1 auVar15 [14];
  undefined1 auVar16 [14];
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  undefined1 auVar25 [12];
  undefined1 auVar28 [14];
  undefined1 auVar29 [14];
  undefined1 auVar30 [14];
  undefined1 auVar31 [14];
  undefined1 auVar32 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar37 [16];
  undefined1 auVar52 [14];
  undefined1 auVar53 [14];
  undefined1 auVar54 [16];
  undefined1 auVar56 [16];
  
  uVar1 = croaring_hardware_support();
  if ((uVar1 & 2) == 0) {
    data = (__m256i *)bitset->words;
    if ((uVar1 & 1) == 0) {
      lVar2 = 0;
      iVar9 = 0;
      iVar22 = 0;
      do {
        uVar12 = *(undefined8 *)((long)data[1] + lVar2);
        uVar11 = *(undefined8 *)((long)*data + lVar2);
        auVar4._0_2_ = (ushort)uVar11 >> 1;
        auVar4._2_2_ = (ushort)((ulong)uVar11 >> 0x10) >> 1;
        auVar4._4_2_ = (ushort)((ulong)uVar11 >> 0x20) >> 1;
        auVar4._6_2_ = (ushort)((ulong)uVar11 >> 0x31);
        auVar4._8_2_ = (ushort)uVar12 >> 1;
        auVar4._10_2_ = (ushort)((ulong)uVar12 >> 0x10) >> 1;
        auVar4._12_2_ = (ushort)((ulong)uVar12 >> 0x20) >> 1;
        auVar4._14_2_ = (ushort)((ulong)uVar12 >> 0x31);
        auVar4 = auVar4 & _DAT_001331a0;
        uVar7 = CONCAT11((char)((ulong)uVar11 >> 8) - auVar4[1],(char)uVar11 - auVar4[0]);
        uVar8 = CONCAT13((char)((ulong)uVar11 >> 0x18) - auVar4[3],
                         CONCAT12((char)((ulong)uVar11 >> 0x10) - auVar4[2],uVar7));
        uVar10 = CONCAT15((char)((ulong)uVar11 >> 0x28) - auVar4[5],
                          CONCAT14((char)((ulong)uVar11 >> 0x20) - auVar4[4],uVar8));
        uVar11 = CONCAT17((char)((ulong)uVar11 >> 0x38) - auVar4[7],
                          CONCAT16((char)((ulong)uVar11 >> 0x30) - auVar4[6],uVar10));
        auVar24._0_10_ =
             CONCAT19((char)((ulong)uVar12 >> 8) - auVar4[9],
                      CONCAT18((char)uVar12 - auVar4[8],uVar11));
        auVar24[10] = (char)((ulong)uVar12 >> 0x10) - auVar4[10];
        auVar24[0xb] = (char)((ulong)uVar12 >> 0x18) - auVar4[0xb];
        auVar28[0xc] = (char)((ulong)uVar12 >> 0x20) - auVar4[0xc];
        auVar28._0_12_ = auVar24;
        auVar28[0xd] = (char)((ulong)uVar12 >> 0x28) - auVar4[0xd];
        auVar32[0xe] = (char)((ulong)uVar12 >> 0x30) - auVar4[0xe];
        auVar32._0_14_ = auVar28;
        auVar32[0xf] = (char)((ulong)uVar12 >> 0x38) - auVar4[0xf];
        auVar4 = auVar32 & _DAT_001331b0;
        auVar33._0_2_ = uVar7 >> 2;
        auVar33._2_2_ = (ushort)((uint)uVar8 >> 0x12);
        auVar33._4_2_ = (ushort)((uint6)uVar10 >> 0x22);
        auVar33._6_2_ = (ushort)((ulong)uVar11 >> 0x32);
        auVar33._8_2_ = (ushort)((unkuint10)auVar24._0_10_ >> 0x42);
        auVar33._10_2_ = auVar24._10_2_ >> 2;
        auVar33._12_2_ = auVar28._12_2_ >> 2;
        auVar33._14_2_ = auVar32._14_2_ >> 2;
        auVar33 = auVar33 & _DAT_001331b0;
        cVar23 = auVar33[0] + auVar4[0];
        bVar41 = auVar33[1] + auVar4[1];
        uVar7 = CONCAT11(bVar41,cVar23);
        cVar42 = auVar33[2] + auVar4[2];
        bVar43 = auVar33[3] + auVar4[3];
        uVar8 = CONCAT13(bVar43,CONCAT12(cVar42,uVar7));
        cVar44 = auVar33[4] + auVar4[4];
        bVar45 = auVar33[5] + auVar4[5];
        uVar10 = CONCAT15(bVar45,CONCAT14(cVar44,uVar8));
        cVar46 = auVar33[6] + auVar4[6];
        bVar47 = auVar33[7] + auVar4[7];
        uVar12 = CONCAT17(bVar47,CONCAT16(cVar46,uVar10));
        cVar48 = auVar33[8] + auVar4[8];
        bVar49 = auVar33[9] + auVar4[9];
        auVar25._0_10_ = CONCAT19(bVar49,CONCAT18(cVar48,uVar12));
        auVar25[10] = auVar33[10] + auVar4[10];
        auVar25[0xb] = auVar33[0xb] + auVar4[0xb];
        auVar29[0xc] = auVar33[0xc] + auVar4[0xc];
        auVar29._0_12_ = auVar25;
        auVar29[0xd] = auVar33[0xd] + auVar4[0xd];
        auVar34[0xe] = auVar33[0xe] + auVar4[0xe];
        auVar34._0_14_ = auVar29;
        auVar34[0xf] = auVar33[0xf] + auVar4[0xf];
        auVar18[0] = (char)(uVar7 >> 4) + cVar23;
        auVar18[1] = (bVar41 >> 4) + bVar41;
        auVar18[2] = (char)(ushort)((uint)uVar8 >> 0x14) + cVar42;
        auVar18[3] = (bVar43 >> 4) + bVar43;
        auVar18[4] = (char)(ushort)((uint6)uVar10 >> 0x24) + cVar44;
        auVar18[5] = (bVar45 >> 4) + bVar45;
        auVar18[6] = (char)(ushort)((ulong)uVar12 >> 0x34) + cVar46;
        auVar18[7] = (bVar47 >> 4) + bVar47;
        auVar18[8] = (char)(ushort)((unkuint10)auVar25._0_10_ >> 0x44) + cVar48;
        auVar18[9] = (bVar49 >> 4) + bVar49;
        auVar18[10] = (char)(auVar25._10_2_ >> 4) + auVar25[10];
        auVar18[0xb] = (auVar25[0xb] >> 4) + auVar25[0xb];
        auVar18[0xc] = (char)(auVar29._12_2_ >> 4) + auVar29[0xc];
        auVar18[0xd] = (auVar29[0xd] >> 4) + auVar29[0xd];
        auVar18[0xe] = (char)(auVar34._14_2_ >> 4) + auVar34[0xe];
        auVar18[0xf] = (auVar34[0xf] >> 4) + auVar34[0xf];
        auVar4 = psadbw(auVar18 & _DAT_001331c0,(undefined1  [16])0x0);
        uVar12 = *(undefined8 *)((long)data[1] + lVar2 + 8);
        uVar11 = *(undefined8 *)((long)*data + lVar2 + 8);
        auVar17._0_2_ = (ushort)uVar11 >> 1;
        auVar17._2_2_ = (ushort)((ulong)uVar11 >> 0x10) >> 1;
        auVar17._4_2_ = (ushort)((ulong)uVar11 >> 0x20) >> 1;
        auVar17._6_2_ = (ushort)((ulong)uVar11 >> 0x31);
        auVar17._8_2_ = (ushort)uVar12 >> 1;
        auVar17._10_2_ = (ushort)((ulong)uVar12 >> 0x10) >> 1;
        auVar17._12_2_ = (ushort)((ulong)uVar12 >> 0x20) >> 1;
        auVar17._14_2_ = (ushort)((ulong)uVar12 >> 0x31);
        auVar17 = auVar17 & _DAT_001331a0;
        uVar7 = CONCAT11((char)((ulong)uVar11 >> 8) - auVar17[1],(char)uVar11 - auVar17[0]);
        uVar8 = CONCAT13((char)((ulong)uVar11 >> 0x18) - auVar17[3],
                         CONCAT12((char)((ulong)uVar11 >> 0x10) - auVar17[2],uVar7));
        uVar10 = CONCAT15((char)((ulong)uVar11 >> 0x28) - auVar17[5],
                          CONCAT14((char)((ulong)uVar11 >> 0x20) - auVar17[4],uVar8));
        uVar11 = CONCAT17((char)((ulong)uVar11 >> 0x38) - auVar17[7],
                          CONCAT16((char)((ulong)uVar11 >> 0x30) - auVar17[6],uVar10));
        auVar26._0_10_ =
             CONCAT19((char)((ulong)uVar12 >> 8) - auVar17[9],
                      CONCAT18((char)uVar12 - auVar17[8],uVar11));
        auVar26[10] = (char)((ulong)uVar12 >> 0x10) - auVar17[10];
        auVar26[0xb] = (char)((ulong)uVar12 >> 0x18) - auVar17[0xb];
        auVar30[0xc] = (char)((ulong)uVar12 >> 0x20) - auVar17[0xc];
        auVar30._0_12_ = auVar26;
        auVar30[0xd] = (char)((ulong)uVar12 >> 0x28) - auVar17[0xd];
        auVar35[0xe] = (char)((ulong)uVar12 >> 0x30) - auVar17[0xe];
        auVar35._0_14_ = auVar30;
        auVar35[0xf] = (char)((ulong)uVar12 >> 0x38) - auVar17[0xf];
        auVar18 = auVar35 & _DAT_001331b0;
        auVar36._0_2_ = uVar7 >> 2;
        auVar36._2_2_ = (ushort)((uint)uVar8 >> 0x12);
        auVar36._4_2_ = (ushort)((uint6)uVar10 >> 0x22);
        auVar36._6_2_ = (ushort)((ulong)uVar11 >> 0x32);
        auVar36._8_2_ = (ushort)((unkuint10)auVar26._0_10_ >> 0x42);
        auVar36._10_2_ = auVar26._10_2_ >> 2;
        auVar36._12_2_ = auVar30._12_2_ >> 2;
        auVar36._14_2_ = auVar35._14_2_ >> 2;
        auVar36 = auVar36 & _DAT_001331b0;
        cVar23 = auVar36[0] + auVar18[0];
        bVar41 = auVar36[1] + auVar18[1];
        uVar7 = CONCAT11(bVar41,cVar23);
        cVar42 = auVar36[2] + auVar18[2];
        bVar43 = auVar36[3] + auVar18[3];
        uVar8 = CONCAT13(bVar43,CONCAT12(cVar42,uVar7));
        cVar44 = auVar36[4] + auVar18[4];
        bVar45 = auVar36[5] + auVar18[5];
        uVar10 = CONCAT15(bVar45,CONCAT14(cVar44,uVar8));
        cVar46 = auVar36[6] + auVar18[6];
        bVar47 = auVar36[7] + auVar18[7];
        uVar12 = CONCAT17(bVar47,CONCAT16(cVar46,uVar10));
        cVar48 = auVar36[8] + auVar18[8];
        bVar49 = auVar36[9] + auVar18[9];
        auVar27._0_10_ = CONCAT19(bVar49,CONCAT18(cVar48,uVar12));
        auVar27[10] = auVar36[10] + auVar18[10];
        auVar27[0xb] = auVar36[0xb] + auVar18[0xb];
        auVar31[0xc] = auVar36[0xc] + auVar18[0xc];
        auVar31._0_12_ = auVar27;
        auVar31[0xd] = auVar36[0xd] + auVar18[0xd];
        auVar37[0xe] = auVar36[0xe] + auVar18[0xe];
        auVar37._0_14_ = auVar31;
        auVar37[0xf] = auVar36[0xf] + auVar18[0xf];
        auVar40[0] = (char)(uVar7 >> 4) + cVar23;
        auVar40[1] = (bVar41 >> 4) + bVar41;
        auVar40[2] = (char)(ushort)((uint)uVar8 >> 0x14) + cVar42;
        auVar40[3] = (bVar43 >> 4) + bVar43;
        auVar40[4] = (char)(ushort)((uint6)uVar10 >> 0x24) + cVar44;
        auVar40[5] = (bVar45 >> 4) + bVar45;
        auVar40[6] = (char)(ushort)((ulong)uVar12 >> 0x34) + cVar46;
        auVar40[7] = (bVar47 >> 4) + bVar47;
        auVar40[8] = (char)(ushort)((unkuint10)auVar27._0_10_ >> 0x44) + cVar48;
        auVar40[9] = (bVar49 >> 4) + bVar49;
        auVar40[10] = (char)(auVar27._10_2_ >> 4) + auVar27[10];
        auVar40[0xb] = (auVar27[0xb] >> 4) + auVar27[0xb];
        auVar40[0xc] = (char)(auVar31._12_2_ >> 4) + auVar31[0xc];
        auVar40[0xd] = (auVar31[0xd] >> 4) + auVar31[0xd];
        auVar40[0xe] = (char)(auVar37._14_2_ >> 4) + auVar37[0xe];
        auVar40[0xf] = (auVar37[0xf] >> 4) + auVar37[0xf];
        auVar17 = psadbw(auVar40 & _DAT_001331c0,(undefined1  [16])0x0);
        uVar12 = *(undefined8 *)((long)data[1] + lVar2 + 0x10);
        uVar11 = *(undefined8 *)((long)*data + lVar2 + 0x10);
        auVar38._0_2_ = (ushort)uVar11 >> 1;
        auVar38._2_2_ = (ushort)((ulong)uVar11 >> 0x10) >> 1;
        auVar38._4_2_ = (ushort)((ulong)uVar11 >> 0x20) >> 1;
        auVar38._6_2_ = (ushort)((ulong)uVar11 >> 0x31);
        auVar38._8_2_ = (ushort)uVar12 >> 1;
        auVar38._10_2_ = (ushort)((ulong)uVar12 >> 0x10) >> 1;
        auVar38._12_2_ = (ushort)((ulong)uVar12 >> 0x20) >> 1;
        auVar38._14_2_ = (ushort)((ulong)uVar12 >> 0x31);
        auVar38 = auVar38 & _DAT_001331a0;
        uVar7 = CONCAT11((char)((ulong)uVar11 >> 8) - auVar38[1],(char)uVar11 - auVar38[0]);
        uVar8 = CONCAT13((char)((ulong)uVar11 >> 0x18) - auVar38[3],
                         CONCAT12((char)((ulong)uVar11 >> 0x10) - auVar38[2],uVar7));
        uVar10 = CONCAT15((char)((ulong)uVar11 >> 0x28) - auVar38[5],
                          CONCAT14((char)((ulong)uVar11 >> 0x20) - auVar38[4],uVar8));
        uVar11 = CONCAT17((char)((ulong)uVar11 >> 0x38) - auVar38[7],
                          CONCAT16((char)((ulong)uVar11 >> 0x30) - auVar38[6],uVar10));
        auVar50._0_10_ =
             CONCAT19((char)((ulong)uVar12 >> 8) - auVar38[9],
                      CONCAT18((char)uVar12 - auVar38[8],uVar11));
        auVar50[10] = (char)((ulong)uVar12 >> 0x10) - auVar38[10];
        auVar50[0xb] = (char)((ulong)uVar12 >> 0x18) - auVar38[0xb];
        auVar52[0xc] = (char)((ulong)uVar12 >> 0x20) - auVar38[0xc];
        auVar52._0_12_ = auVar50;
        auVar52[0xd] = (char)((ulong)uVar12 >> 0x28) - auVar38[0xd];
        auVar54[0xe] = (char)((ulong)uVar12 >> 0x30) - auVar38[0xe];
        auVar54._0_14_ = auVar52;
        auVar54[0xf] = (char)((ulong)uVar12 >> 0x38) - auVar38[0xf];
        auVar18 = auVar54 & _DAT_001331b0;
        auVar55._0_2_ = uVar7 >> 2;
        auVar55._2_2_ = (ushort)((uint)uVar8 >> 0x12);
        auVar55._4_2_ = (ushort)((uint6)uVar10 >> 0x22);
        auVar55._6_2_ = (ushort)((ulong)uVar11 >> 0x32);
        auVar55._8_2_ = (ushort)((unkuint10)auVar50._0_10_ >> 0x42);
        auVar55._10_2_ = auVar50._10_2_ >> 2;
        auVar55._12_2_ = auVar52._12_2_ >> 2;
        auVar55._14_2_ = auVar54._14_2_ >> 2;
        auVar55 = auVar55 & _DAT_001331b0;
        cVar23 = auVar55[0] + auVar18[0];
        bVar41 = auVar55[1] + auVar18[1];
        uVar7 = CONCAT11(bVar41,cVar23);
        cVar42 = auVar55[2] + auVar18[2];
        bVar43 = auVar55[3] + auVar18[3];
        uVar8 = CONCAT13(bVar43,CONCAT12(cVar42,uVar7));
        cVar44 = auVar55[4] + auVar18[4];
        bVar45 = auVar55[5] + auVar18[5];
        uVar10 = CONCAT15(bVar45,CONCAT14(cVar44,uVar8));
        cVar46 = auVar55[6] + auVar18[6];
        bVar47 = auVar55[7] + auVar18[7];
        uVar12 = CONCAT17(bVar47,CONCAT16(cVar46,uVar10));
        cVar48 = auVar55[8] + auVar18[8];
        bVar49 = auVar55[9] + auVar18[9];
        auVar51._0_10_ = CONCAT19(bVar49,CONCAT18(cVar48,uVar12));
        auVar51[10] = auVar55[10] + auVar18[10];
        auVar51[0xb] = auVar55[0xb] + auVar18[0xb];
        auVar53[0xc] = auVar55[0xc] + auVar18[0xc];
        auVar53._0_12_ = auVar51;
        auVar53[0xd] = auVar55[0xd] + auVar18[0xd];
        auVar56[0xe] = auVar55[0xe] + auVar18[0xe];
        auVar56._0_14_ = auVar53;
        auVar56[0xf] = auVar55[0xf] + auVar18[0xf];
        auVar39[0] = (char)(uVar7 >> 4) + cVar23;
        auVar39[1] = (bVar41 >> 4) + bVar41;
        auVar39[2] = (char)(ushort)((uint)uVar8 >> 0x14) + cVar42;
        auVar39[3] = (bVar43 >> 4) + bVar43;
        auVar39[4] = (char)(ushort)((uint6)uVar10 >> 0x24) + cVar44;
        auVar39[5] = (bVar45 >> 4) + bVar45;
        auVar39[6] = (char)(ushort)((ulong)uVar12 >> 0x34) + cVar46;
        auVar39[7] = (bVar47 >> 4) + bVar47;
        auVar39[8] = (char)(ushort)((unkuint10)auVar51._0_10_ >> 0x44) + cVar48;
        auVar39[9] = (bVar49 >> 4) + bVar49;
        auVar39[10] = (char)(auVar51._10_2_ >> 4) + auVar51[10];
        auVar39[0xb] = (auVar51[0xb] >> 4) + auVar51[0xb];
        auVar39[0xc] = (char)(auVar53._12_2_ >> 4) + auVar53[0xc];
        auVar39[0xd] = (auVar53[0xd] >> 4) + auVar53[0xd];
        auVar39[0xe] = (char)(auVar56._14_2_ >> 4) + auVar56[0xe];
        auVar39[0xf] = (auVar56[0xf] >> 4) + auVar56[0xf];
        auVar40 = psadbw(auVar39 & _DAT_001331c0,(undefined1  [16])0x0);
        uVar12 = *(undefined8 *)((long)data[1] + lVar2 + 0x18);
        uVar11 = *(undefined8 *)((long)*data + lVar2 + 0x18);
        auVar5._0_2_ = (ushort)uVar11 >> 1;
        auVar5._2_2_ = (ushort)((ulong)uVar11 >> 0x10) >> 1;
        auVar5._4_2_ = (ushort)((ulong)uVar11 >> 0x20) >> 1;
        auVar5._6_2_ = (ushort)((ulong)uVar11 >> 0x31);
        auVar5._8_2_ = (ushort)uVar12 >> 1;
        auVar5._10_2_ = (ushort)((ulong)uVar12 >> 0x10) >> 1;
        auVar5._12_2_ = (ushort)((ulong)uVar12 >> 0x20) >> 1;
        auVar5._14_2_ = (ushort)((ulong)uVar12 >> 0x31);
        auVar5 = auVar5 & _DAT_001331a0;
        uVar7 = CONCAT11((char)((ulong)uVar11 >> 8) - auVar5[1],(char)uVar11 - auVar5[0]);
        uVar8 = CONCAT13((char)((ulong)uVar11 >> 0x18) - auVar5[3],
                         CONCAT12((char)((ulong)uVar11 >> 0x10) - auVar5[2],uVar7));
        uVar10 = CONCAT15((char)((ulong)uVar11 >> 0x28) - auVar5[5],
                          CONCAT14((char)((ulong)uVar11 >> 0x20) - auVar5[4],uVar8));
        uVar11 = CONCAT17((char)((ulong)uVar11 >> 0x38) - auVar5[7],
                          CONCAT16((char)((ulong)uVar11 >> 0x30) - auVar5[6],uVar10));
        auVar13._0_10_ =
             CONCAT19((char)((ulong)uVar12 >> 8) - auVar5[9],
                      CONCAT18((char)uVar12 - auVar5[8],uVar11));
        auVar13[10] = (char)((ulong)uVar12 >> 0x10) - auVar5[10];
        auVar13[0xb] = (char)((ulong)uVar12 >> 0x18) - auVar5[0xb];
        auVar15[0xc] = (char)((ulong)uVar12 >> 0x20) - auVar5[0xc];
        auVar15._0_12_ = auVar13;
        auVar15[0xd] = (char)((ulong)uVar12 >> 0x28) - auVar5[0xd];
        auVar19[0xe] = (char)((ulong)uVar12 >> 0x30) - auVar5[0xe];
        auVar19._0_14_ = auVar15;
        auVar19[0xf] = (char)((ulong)uVar12 >> 0x38) - auVar5[0xf];
        auVar18 = auVar19 & _DAT_001331b0;
        auVar20._0_2_ = uVar7 >> 2;
        auVar20._2_2_ = (ushort)((uint)uVar8 >> 0x12);
        auVar20._4_2_ = (ushort)((uint6)uVar10 >> 0x22);
        auVar20._6_2_ = (ushort)((ulong)uVar11 >> 0x32);
        auVar20._8_2_ = (ushort)((unkuint10)auVar13._0_10_ >> 0x42);
        auVar20._10_2_ = auVar13._10_2_ >> 2;
        auVar20._12_2_ = auVar15._12_2_ >> 2;
        auVar20._14_2_ = auVar19._14_2_ >> 2;
        auVar20 = auVar20 & _DAT_001331b0;
        cVar23 = auVar20[0] + auVar18[0];
        bVar41 = auVar20[1] + auVar18[1];
        uVar7 = CONCAT11(bVar41,cVar23);
        cVar42 = auVar20[2] + auVar18[2];
        bVar43 = auVar20[3] + auVar18[3];
        uVar8 = CONCAT13(bVar43,CONCAT12(cVar42,uVar7));
        cVar44 = auVar20[4] + auVar18[4];
        bVar45 = auVar20[5] + auVar18[5];
        uVar10 = CONCAT15(bVar45,CONCAT14(cVar44,uVar8));
        cVar46 = auVar20[6] + auVar18[6];
        bVar47 = auVar20[7] + auVar18[7];
        uVar12 = CONCAT17(bVar47,CONCAT16(cVar46,uVar10));
        cVar48 = auVar20[8] + auVar18[8];
        bVar49 = auVar20[9] + auVar18[9];
        auVar14._0_10_ = CONCAT19(bVar49,CONCAT18(cVar48,uVar12));
        auVar14[10] = auVar20[10] + auVar18[10];
        auVar14[0xb] = auVar20[0xb] + auVar18[0xb];
        auVar16[0xc] = auVar20[0xc] + auVar18[0xc];
        auVar16._0_12_ = auVar14;
        auVar16[0xd] = auVar20[0xd] + auVar18[0xd];
        auVar21[0xe] = auVar20[0xe] + auVar18[0xe];
        auVar21._0_14_ = auVar16;
        auVar21[0xf] = auVar20[0xf] + auVar18[0xf];
        auVar6[0] = (char)(uVar7 >> 4) + cVar23;
        auVar6[1] = (bVar41 >> 4) + bVar41;
        auVar6[2] = (char)(ushort)((uint)uVar8 >> 0x14) + cVar42;
        auVar6[3] = (bVar43 >> 4) + bVar43;
        auVar6[4] = (char)(ushort)((uint6)uVar10 >> 0x24) + cVar44;
        auVar6[5] = (bVar45 >> 4) + bVar45;
        auVar6[6] = (char)(ushort)((ulong)uVar12 >> 0x34) + cVar46;
        auVar6[7] = (bVar47 >> 4) + bVar47;
        auVar6[8] = (char)(ushort)((unkuint10)auVar14._0_10_ >> 0x44) + cVar48;
        auVar6[9] = (bVar49 >> 4) + bVar49;
        auVar6[10] = (char)(auVar14._10_2_ >> 4) + auVar14[10];
        auVar6[0xb] = (auVar14[0xb] >> 4) + auVar14[0xb];
        auVar6[0xc] = (char)(auVar16._12_2_ >> 4) + auVar16[0xc];
        auVar6[0xd] = (auVar16[0xd] >> 4) + auVar16[0xd];
        auVar6[0xe] = (char)(auVar21._14_2_ >> 4) + auVar21[0xe];
        auVar6[0xf] = (auVar21[0xf] >> 4) + auVar21[0xf];
        auVar18 = psadbw(auVar6 & _DAT_001331c0,(undefined1  [16])0x0);
        iVar9 = auVar18._0_4_ + auVar40._0_4_ + auVar17._0_4_ + auVar4._0_4_ + iVar9;
        iVar22 = auVar18._8_4_ + auVar40._8_4_ + auVar17._8_4_ + auVar4._8_4_ + iVar22;
        lVar2 = lVar2 + 0x40;
      } while (lVar2 != 0x2000);
      iVar22 = iVar22 + iVar9;
    }
    else {
      uVar3 = avx2_harley_seal_popcount256(data,in_RSI);
      iVar22 = (int)uVar3;
    }
  }
  else {
    uVar3 = avx512_vpopcount((__m512i *)bitset->words,in_RSI);
    iVar22 = (int)uVar3;
  }
  return iVar22;
}

Assistant:

int bitset_container_compute_cardinality(const bitset_container_t *bitset) {
    int support = croaring_hardware_support();
#if CROARING_COMPILER_SUPPORTS_AVX512
    if (support & ROARING_SUPPORTS_AVX512) {
        return (int)avx512_vpopcount(
            (const __m512i *)bitset->words,
            BITSET_CONTAINER_SIZE_IN_WORDS / (WORDS_IN_AVX512_REG));
    } else
#endif  // CROARING_COMPILER_SUPPORTS_AVX512
        if (support & ROARING_SUPPORTS_AVX2) {
            return (int)avx2_harley_seal_popcount256(
                (const __m256i *)bitset->words,
                BITSET_CONTAINER_SIZE_IN_WORDS / (CROARING_WORDS_IN_AVX2_REG));
        } else {
            return _scalar_bitset_container_compute_cardinality(bitset);
        }
}